

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# measunit.cpp
# Opt level: O2

MeasureUnit *
icu_63::MeasureUnit::resolveUnitPerUnit
          (MeasureUnit *__return_storage_ptr__,MeasureUnit *unit,MeasureUnit *perUnit,
          bool *isResolved)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  
  iVar5 = unit->fSubTypeId + (&gOffsets)[unit->fTypeId];
  iVar6 = perUnit->fSubTypeId + (&gOffsets)[perUnit->fTypeId];
  iVar4 = 0;
  iVar3 = 8;
LAB_00255626:
  do {
    iVar2 = iVar3;
    if (iVar2 <= iVar4) {
      *isResolved = false;
      (__return_storage_ptr__->super_UObject)._vptr_UObject =
           (_func_int **)&PTR__MeasureUnit_003d5de0;
      __return_storage_ptr__->fCurrency[0] = '\0';
      __return_storage_ptr__->fTypeId = 0xe;
      __return_storage_ptr__->fSubTypeId = 0;
      return __return_storage_ptr__;
    }
    iVar3 = (iVar4 + iVar2) / 2;
    lVar7 = (long)iVar3 * 0x10;
  } while (iVar5 < *(int *)(unitPerUnitToSingleUnit + lVar7));
  if (iVar5 <= *(int *)(unitPerUnitToSingleUnit + lVar7)) goto code_r0x00255646;
  goto LAB_0025564e;
code_r0x00255646:
  if (*(int *)(unitPerUnitToSingleUnit + lVar7 + 4) <= iVar6) {
    if (iVar6 <= *(int *)(unitPerUnitToSingleUnit + lVar7 + 4)) {
      *isResolved = true;
      (__return_storage_ptr__->super_UObject)._vptr_UObject =
           (_func_int **)&PTR__MeasureUnit_003d5de0;
      uVar1 = *(undefined8 *)(unitPerUnitToSingleUnit + lVar7 + 8);
      __return_storage_ptr__->fTypeId = (int)uVar1;
      __return_storage_ptr__->fSubTypeId = (int)((ulong)uVar1 >> 0x20);
      __return_storage_ptr__->fCurrency[0] = '\0';
      return __return_storage_ptr__;
    }
LAB_0025564e:
    iVar4 = iVar3 + 1;
    iVar3 = iVar2;
  }
  goto LAB_00255626;
}

Assistant:

int32_t MeasureUnit::getOffset() const {
    return gOffsets[fTypeId] + fSubTypeId;
}